

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O0

LY_ERR lyb_print_data(ly_out *out,lyd_node *root,uint32_t options)

{
  lyd_ctx *lydctx;
  anon_struct_24_3_37108ca1 *paVar1;
  lysc_node *plVar2;
  lysc_node *local_50;
  ly_ctx *local_48;
  ly_ctx *local_40;
  ly_ctx *ctx;
  lyd_lyb_ctx *lybctx;
  LY_ERR local_20;
  uint32_t uStack_1c;
  uint8_t zero;
  LY_ERR ret;
  uint32_t options_local;
  lyd_node *root_local;
  ly_out *out_local;
  
  local_20 = 0;
  lybctx._7_1_ = 0;
  if (root == (lyd_node *)0x0) {
    local_48 = (ly_ctx *)0x0;
  }
  else {
    if (root->schema == (lysc_node *)0x0) {
      local_40 = (ly_ctx *)root[2].schema;
    }
    else {
      local_40 = root->schema->module->ctx;
    }
    local_48 = local_40;
  }
  uStack_1c = options;
  _ret = root;
  root_local = (lyd_node *)out;
  lydctx = (lyd_ctx *)calloc(1,0x1080);
  if (lydctx == (lyd_ctx *)0x0) {
    ly_log(local_48,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyb_print_data");
    local_20 = LY_EMEM;
  }
  else {
    paVar1 = (anon_struct_24_3_37108ca1 *)calloc(1,0x38);
    lydctx->data_ctx = paVar1;
    if (lydctx->data_ctx == (anon_struct_24_3_37108ca1 *)0x0) {
      ly_log(local_48,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyb_print_data");
      local_20 = LY_EMEM;
    }
    else {
      lydctx->parse_opts = uStack_1c;
      if ((_ret != (lyd_node *)0x0) &&
         (lydctx->data_ctx->ctx = local_48, _ret->schema != (lysc_node *)0x0)) {
        if (_ret->schema == (lysc_node *)0x0) {
          local_50 = (lysc_node *)0x0;
        }
        else {
          local_50 = _ret->schema->parent;
        }
        plVar2 = lysc_data_node(local_50);
        if (plVar2 != (lysc_node *)0x0) {
          ly_log(lydctx->data_ctx->ctx,LY_LLERR,LY_EINVAL,
                 "LYB printer supports only printing top-level nodes.");
          local_20 = LY_EINVAL;
          goto LAB_0015d57c;
        }
      }
      local_20 = lyb_print_magic_number((ly_out *)root_local);
      if ((((local_20 == LY_SUCCESS) &&
           (local_20 = lyb_print_header((ly_out *)root_local), local_20 == LY_SUCCESS)) &&
          (local_20 = lyb_print_data_models((ly_out *)root_local,_ret,(lylyb_ctx *)lydctx->data_ctx)
          , local_20 == LY_SUCCESS)) &&
         (local_20 = lyb_print_siblings((ly_out *)root_local,_ret,(lyd_lyb_ctx *)lydctx),
         local_20 == LY_SUCCESS)) {
        local_20 = lyb_write((ly_out *)root_local,(uint8_t *)((long)&lybctx + 7),1,
                             (lylyb_ctx *)lydctx->data_ctx);
      }
    }
  }
LAB_0015d57c:
  lyd_lyb_ctx_free(lydctx);
  return local_20;
}

Assistant:

LY_ERR
lyb_print_data(struct ly_out *out, const struct lyd_node *root, uint32_t options)
{
    LY_ERR ret = LY_SUCCESS;
    uint8_t zero = 0;
    struct lyd_lyb_ctx *lybctx;
    const struct ly_ctx *ctx = root ? LYD_CTX(root) : NULL;

    lybctx = calloc(1, sizeof *lybctx);
    LY_CHECK_ERR_GOTO(!lybctx, LOGMEM(ctx); ret = LY_EMEM, cleanup);
    lybctx->lybctx = calloc(1, sizeof *lybctx->lybctx);
    LY_CHECK_ERR_GOTO(!lybctx->lybctx, LOGMEM(ctx); ret = LY_EMEM, cleanup);

    lybctx->print_options = options;
    if (root) {
        lybctx->lybctx->ctx = ctx;

        if (root->schema && lysc_data_parent(root->schema)) {
            LOGERR(lybctx->lybctx->ctx, LY_EINVAL, "LYB printer supports only printing top-level nodes.");
            ret = LY_EINVAL;
            goto cleanup;
        }
    }

    /* LYB magic number */
    LY_CHECK_GOTO(ret = lyb_print_magic_number(out), cleanup);

    /* LYB header */
    LY_CHECK_GOTO(ret = lyb_print_header(out), cleanup);

    /* all used models */
    LY_CHECK_GOTO(ret = lyb_print_data_models(out, root, lybctx->lybctx), cleanup);

    ret = lyb_print_siblings(out, root, lybctx);
    LY_CHECK_GOTO(ret, cleanup);

    /* ending zero byte */
    LY_CHECK_GOTO(ret = lyb_write(out, &zero, sizeof zero, lybctx->lybctx), cleanup);

cleanup:
    lyd_lyb_ctx_free((struct lyd_ctx *)lybctx);
    return ret;
}